

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

void Llb_ManPrepareGroups(Llb_Man_t *pMan)

{
  Aig_Obj_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Aig_Man_t *pAVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  if (pMan->vGroups != (Vec_Ptr_t *)0x0) {
    __assert_fail("pMan->vGroups == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                  ,0x168,"void Llb_ManPrepareGroups(Llb_Man_t *)");
  }
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pMan->vGroups = pVVar2;
  Llb_ManGroupCreateFirst(pMan);
  pVVar2 = pMan->pAig->vObjs;
  if (0 < pVVar2->nSize) {
    lVar7 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)pVVar2->pArray[lVar7];
      if (((pAVar1 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar1->field_0x18 & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)&pAVar1->field_0x18 & 7) - 7)) {
        Llb_ManGroupCreate(pMan,pAVar1);
      }
      lVar7 = lVar7 + 1;
      pVVar2 = pMan->pAig->vObjs;
    } while (lVar7 < pVVar2->nSize);
  }
  pAVar4 = pMan->pAig;
  if (0 < pAVar4->nRegs) {
    iVar6 = 0;
    do {
      uVar5 = pAVar4->nTruePos + iVar6;
      if (((int)uVar5 < 0) || (pAVar4->vCos->nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar1 = (Aig_Obj_t *)pAVar4->vCos->pArray[uVar5];
      if ((pAVar1->field_0x18 & 0x10) != 0) {
        Llb_ManGroupCreate(pMan,pAVar1);
      }
      iVar6 = iVar6 + 1;
      pAVar4 = pMan->pAig;
    } while (iVar6 < pAVar4->nRegs);
  }
  Llb_ManGroupCreateLast(pMan);
  return;
}

Assistant:

void Llb_ManPrepareGroups( Llb_Man_t * pMan )
{
    Aig_Obj_t * pObj;
    int i;
    assert( pMan->vGroups == NULL );
    pMan->vGroups = Vec_PtrAlloc( 1000 );
    Llb_ManGroupCreateFirst( pMan );
    Aig_ManForEachNode( pMan->pAig, pObj, i )
    {
        if ( pObj->fMarkA )
            Llb_ManGroupCreate( pMan, pObj );
    }
    Saig_ManForEachLi( pMan->pAig, pObj, i )
    {
        if ( pObj->fMarkA )
            Llb_ManGroupCreate( pMan, pObj );
    }
    Llb_ManGroupCreateLast( pMan );
}